

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O2

void __thiscall
fizplex::ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test::TestBody
          (ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test *this)

{
  SVector *rhs;
  long lVar1;
  char *message;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector::Nonzero> l_02;
  initializer_list<fizplex::SVector> colList;
  AssertionResult gtest_ar;
  SVector SStack_110;
  SVector local_f8;
  SVector new_col;
  ColMatrix m;
  Nonzero local_78;
  undefined8 local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Nonzero local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  new_col.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  new_col.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_col.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x401c000000000000;
  l._M_len = 3;
  l._M_array = (iterator)&new_col;
  SVector::SVector((SVector *)&gtest_ar,l);
  local_28 = 2;
  uStack_20 = 0x4010000000000000;
  local_38 = 1;
  uStack_30 = 0x4008000000000000;
  local_48.index = 0;
  local_48.value = 2.0;
  l_00._M_len = 3;
  l_00._M_array = &local_48;
  SVector::SVector(&SStack_110,l_00);
  local_58 = 2;
  uStack_50 = 0xc000000000000000;
  local_68 = 1;
  puStack_60 = &DAT_bff0000000000000;
  local_78.index = 0;
  local_78.value = 1.0;
  l_01._M_len = 3;
  l_01._M_array = &local_78;
  SVector::SVector(&local_f8,l_01);
  colList._M_len = 3;
  colList._M_array = (iterator)&gtest_ar;
  ColMatrix::ColMatrix(&m,3,3,colList);
  lVar1 = 0x30;
  do {
    std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
    ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                   *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  SStack_110.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3;
  SStack_110.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4008000000000000;
  SStack_110.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_3ff0000000000000;
  l_02._M_len = 3;
  l_02._M_array = (iterator)&gtest_ar;
  SVector::SVector(&new_col,l_02);
  ColMatrix::add_column(&m,&new_col);
  rhs = ColMatrix::column(&m,3);
  testing::internal::CmpHelperEQ<fizplex::SVector,fizplex::SVector>
            ((internal *)&gtest_ar,"new_col","m.column(3)",&new_col,rhs);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x49,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
  ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                 *)&new_col);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&m.cols);
  return;
}

Assistant:

TEST(ColMatrix, AddColumnAndValuesToNonEmptyMatrix) {
  ColMatrix m(3, 3,
              {{{0, 7}, {2, -3}, {1, 0.0}},
               {{0, 2}, {1, 3}, {2, 4}},
               {{0, 1}, {1, -1}, {2, -2}}});
  const SVector new_col = {{0, 1.0}, {2, 2.0}, {3, 3.0}};
  m.add_column(new_col);
  EXPECT_EQ(new_col, m.column(3));
}